

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O3

TypeHandle * __thiscall
IntrusiveList<TypeHandle>::operator[](IntrusiveList<TypeHandle> *this,uint index)

{
  TypeHandle *pTVar1;
  uint uVar2;
  
  pTVar1 = this->head;
  uVar2 = index;
  if (pTVar1 != (TypeHandle *)0x0 && index != 0) {
    do {
      index = uVar2 - 1;
      pTVar1 = pTVar1->next;
      if (uVar2 == 1) break;
      uVar2 = index;
    } while (pTVar1 != (TypeHandle *)0x0);
  }
  if (index == 0) {
    return pTVar1;
  }
  __assert_fail("index == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x3f,
                "T *IntrusiveList<TypeHandle>::operator[](unsigned int) const [T = TypeHandle]");
}

Assistant:

T* operator[](unsigned index) const
	{
		T *curr = head;

		while(index && curr)
		{
			curr = curr->next;
			index--;
		}

		assert(index == 0);

		return curr;
	}